

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

void __thiscall
TEST_MockComparatorCopierTest_twoCustomTypeOutputParameters_Test::testBody
          (TEST_MockComparatorCopierTest_twoCustomTypeOutputParameters_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  char *pcVar6;
  char *pcVar7;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  MyTypeForTesting actualObject2;
  MyTypeForTesting expectedObject2;
  MyTypeForTesting actualObject1;
  MyTypeForTesting expectedObject1;
  MyTypeForTestingCopier copier;
  
  MyTypeForTesting::MyTypeForTesting(&expectedObject1,0x221);
  MyTypeForTesting::MyTypeForTesting(&actualObject1,0x3d3);
  MyTypeForTesting::MyTypeForTesting(&expectedObject2,0x7b);
  MyTypeForTesting::MyTypeForTesting(&actualObject2,0x11d7);
  copier.super_MockNamedValueCopier._vptr_MockNamedValueCopier =
       (MockNamedValueCopier)&PTR__MockNamedValueCopier_002bc998;
  SimpleString::SimpleString(&local_b0,"");
  pMVar2 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_a0,&copier);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar2 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_a0);
  SimpleString::SimpleString(&local_70,"MyTypeForTesting");
  SimpleString::SimpleString(&local_80,"parameterName");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_70,&local_80,
                              &expectedObject1);
  SimpleString::SimpleString(&local_90,"id");
  (**(code **)(*plVar3 + 0x58))(plVar3,&local_90,1);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar2 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_a0);
  SimpleString::SimpleString(&local_70,"MyTypeForTesting");
  SimpleString::SimpleString(&local_80,"parameterName");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x38))
                             ((long *)CONCAT44(extraout_var_00,iVar1),&local_70,&local_80,
                              &expectedObject2);
  SimpleString::SimpleString(&local_90,"id");
  (**(code **)(*plVar3 + 0x58))(plVar3,&local_90,2);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar2 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_a0);
  SimpleString::SimpleString(&local_70,"MyTypeForTesting");
  SimpleString::SimpleString(&local_80,"parameterName");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x30))
                             ((long *)CONCAT44(extraout_var_01,iVar1),&local_70,&local_80,
                              &actualObject1);
  SimpleString::SimpleString(&local_90,"id");
  (**(code **)(*plVar3 + 0x40))(plVar3,&local_90,1);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar2 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_a0);
  SimpleString::SimpleString(&local_70,"MyTypeForTesting");
  SimpleString::SimpleString(&local_80,"parameterName");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x30))
                             ((long *)CONCAT44(extraout_var_02,iVar1),&local_70,&local_80,
                              &actualObject2);
  SimpleString::SimpleString(&local_90,"id");
  (**(code **)(*plVar3 + 0x40))(plVar3,&local_90,2);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar2 = mock(&local_b0,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_b0);
  if (*expectedObject1.value == 0x221) {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,300,pTVar5);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_b0);
    pcVar6 = SimpleString::asCharString(&local_b0);
    ::StringFrom((long)&local_a0);
    pcVar7 = SimpleString::asCharString(&local_a0);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,300,pTVar5);
    SimpleString::~SimpleString(&local_a0);
    SimpleString::~SimpleString(&local_b0);
  }
  if (*actualObject1.value == 0x221) {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x12d,pTVar5);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_b0);
    pcVar6 = SimpleString::asCharString(&local_b0);
    ::StringFrom((long)&local_a0);
    pcVar7 = SimpleString::asCharString(&local_a0);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x12d,pTVar5);
    SimpleString::~SimpleString(&local_a0);
    SimpleString::~SimpleString(&local_b0);
  }
  if (*expectedObject2.value == 0x7b) {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x12e,pTVar5);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_b0);
    pcVar6 = SimpleString::asCharString(&local_b0);
    ::StringFrom((long)&local_a0);
    pcVar7 = SimpleString::asCharString(&local_a0);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x12e,pTVar5);
    SimpleString::~SimpleString(&local_a0);
    SimpleString::~SimpleString(&local_b0);
  }
  if (*actualObject2.value == 0x7b) {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x12f,pTVar5);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_b0);
    pcVar6 = SimpleString::asCharString(&local_b0);
    ::StringFrom((long)&local_a0);
    pcVar7 = SimpleString::asCharString(&local_a0);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x12f,pTVar5);
    SimpleString::~SimpleString(&local_a0);
    SimpleString::~SimpleString(&local_b0);
  }
  SimpleString::SimpleString(&local_b0,"");
  pMVar2 = mock(&local_b0,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString(&local_b0);
  MyTypeForTesting::~MyTypeForTesting(&actualObject2);
  MyTypeForTesting::~MyTypeForTesting(&expectedObject2);
  MyTypeForTesting::~MyTypeForTesting(&actualObject1);
  MyTypeForTesting::~MyTypeForTesting(&expectedObject1);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, twoCustomTypeOutputParameters)
{
    MyTypeForTesting expectedObject1(545);
    MyTypeForTesting actualObject1(979);
    MyTypeForTesting expectedObject2(123);
    MyTypeForTesting actualObject2(4567);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    mock().expectOneCall("function").withOutputParameterOfTypeReturning("MyTypeForTesting", "parameterName", &expectedObject1).withParameter("id", 1);
    mock().expectOneCall("function").withOutputParameterOfTypeReturning("MyTypeForTesting", "parameterName", &expectedObject2).withParameter("id", 2);
    mock().actualCall("function").withOutputParameterOfType("MyTypeForTesting", "parameterName", &actualObject1).withParameter("id", 1);
    mock().actualCall("function").withOutputParameterOfType("MyTypeForTesting", "parameterName", &actualObject2).withParameter("id", 2);

    mock().checkExpectations();
    CHECK_EQUAL(545, *(expectedObject1.value));
    CHECK_EQUAL(545, *(actualObject1.value));
    CHECK_EQUAL(123, *(expectedObject2.value));
    CHECK_EQUAL(123, *(actualObject2.value));

    mock().removeAllComparatorsAndCopiers();
}